

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olcPixelGameEngine.h
# Opt level: O1

Pixel * __thiscall olc::Pixel::operator*=(Pixel *this,float i)

{
  float fVar1;
  
  fVar1 = (float)(this->field_0).field_1.r * i;
  if (fVar1 <= 0.0) {
    fVar1 = 0.0;
  }
  if (255.0 <= fVar1) {
    fVar1 = 255.0;
  }
  (this->field_0).field_1.r = (uint8_t)(int)fVar1;
  fVar1 = (float)(this->field_0).field_1.g * i;
  if (fVar1 <= 0.0) {
    fVar1 = 0.0;
  }
  if (255.0 <= fVar1) {
    fVar1 = 255.0;
  }
  (this->field_0).field_1.g = (uint8_t)(int)fVar1;
  fVar1 = (float)(this->field_0).field_1.b * i;
  if (fVar1 <= 0.0) {
    fVar1 = 0.0;
  }
  if (255.0 <= fVar1) {
    fVar1 = 255.0;
  }
  (this->field_0).field_1.b = (uint8_t)(int)fVar1;
  return this;
}

Assistant:

Pixel &Pixel::operator*=(const float i)
	{
		this->r = uint8_t(std::min(255.0f, std::max(0.0f, float(r) * i)));
		this->g = uint8_t(std::min(255.0f, std::max(0.0f, float(g) * i)));
		this->b = uint8_t(std::min(255.0f, std::max(0.0f, float(b) * i)));
		return *this;
	}